

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::IsStruct
          (ProtoStreamObjectWriter *this,Field *field)

{
  string *psVar1;
  converter *this_00;
  char *size;
  int iVar2;
  stringpiece_ssize_type in_RDX;
  stringpiece_ssize_type extraout_RDX;
  bool bVar3;
  StringPiece SVar4;
  
  psVar1 = (field->type_url_).ptr_;
  this_00 = (converter *)(psVar1->_M_dataplus)._M_p;
  size = (char *)psVar1->_M_string_length;
  if ((long)size < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
    in_RDX = extraout_RDX;
  }
  SVar4.length_ = in_RDX;
  SVar4.ptr_ = size;
  SVar4 = GetTypeWithoutUrl(this_00,SVar4);
  if (SVar4.length_ == 0x16) {
    if (SVar4.ptr_ == "google.protobuf.Struct") {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(SVar4.ptr_,"google.protobuf.Struct",0x16);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ProtoStreamObjectWriter::IsStruct(const google::protobuf::Field& field) {
  return GetTypeWithoutUrl(field.type_url()) == kStructType;
}